

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalNestedLoopJoin::GetData
          (PhysicalNestedLoopJoin *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  pointer pGVar1;
  
  pGVar1 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  OuterJoinMarker::Scan
            ((OuterJoinMarker *)&pGVar1[4].super_StateWithBlockableTasks,
             (OuterJoinGlobalScanState *)&input->global_state[1].super_StateWithBlockableTasks,
             (OuterJoinLocalScanState *)(input->local_state + 1),chunk);
  return chunk->count == 0;
}

Assistant:

SourceResultType PhysicalNestedLoopJoin::GetData(ExecutionContext &context, DataChunk &chunk,
                                                 OperatorSourceInput &input) const {
	D_ASSERT(PropagatesBuildSide(join_type));
	// check if we need to scan any unmatched tuples from the RHS for the full/right outer join
	auto &sink = sink_state->Cast<NestedLoopJoinGlobalState>();
	auto &gstate = input.global_state.Cast<NestedLoopJoinGlobalScanState>();
	auto &lstate = input.local_state.Cast<NestedLoopJoinLocalScanState>();

	// if the LHS is exhausted in a FULL/RIGHT OUTER JOIN, we scan chunks we still need to output
	sink.right_outer.Scan(gstate.scan_state, lstate.scan_state, chunk);

	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}